

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::iterationRecordMajor(HighsSimplexAnalysis *this)

{
  double dVar1;
  double fraction_of_possible_minor_iterations_performed;
  HighsSimplexAnalysis *this_local;
  
  this->sum_multi_chosen = this->multi_chosen + this->sum_multi_chosen;
  this->sum_multi_finished = this->multi_finished + this->sum_multi_finished;
  dVar1 = ((double)this->multi_finished * 1.0) / (double)this->multi_chosen;
  if (0.0 < this->average_fraction_of_possible_minor_iterations_performed ||
      this->average_fraction_of_possible_minor_iterations_performed == 0.0) {
    this->average_fraction_of_possible_minor_iterations_performed =
         dVar1 * 0.05 + this->average_fraction_of_possible_minor_iterations_performed * 0.95;
  }
  else {
    this->average_fraction_of_possible_minor_iterations_performed = dVar1;
  }
  if (0.0 < this->average_concurrency || this->average_concurrency == 0.0) {
    this->average_concurrency =
         (double)this->num_concurrency * 0.05 + this->average_concurrency * 0.95;
  }
  else {
    this->average_concurrency = (double)this->num_concurrency;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::iterationRecordMajor() {
  assert(analyse_simplex_summary_data);
  sum_multi_chosen += multi_chosen;
  sum_multi_finished += multi_finished;
  assert(multi_chosen > 0);
  const double fraction_of_possible_minor_iterations_performed =
      1.0 * multi_finished / multi_chosen;
  if (average_fraction_of_possible_minor_iterations_performed < 0) {
    average_fraction_of_possible_minor_iterations_performed =
        fraction_of_possible_minor_iterations_performed;
  } else {
    average_fraction_of_possible_minor_iterations_performed =
        kRunningAverageMultiplier *
            fraction_of_possible_minor_iterations_performed +
        (1 - kRunningAverageMultiplier) *
            average_fraction_of_possible_minor_iterations_performed;
  }
  if (average_concurrency < 0) {
    average_concurrency = num_concurrency;
  } else {
    average_concurrency = kRunningAverageMultiplier * num_concurrency +
                          (1 - kRunningAverageMultiplier) * average_concurrency;
  }
}